

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamReaderPrivate::raiseError(QXmlStreamReaderPrivate *this,Error error,QString *message)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char *sourceText;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->error = error;
  QString::operator=(&this->errorString,message);
  if ((this->errorString).d.ptr == (char16_t *)0x0) {
    if (error == CustomError) {
      sourceText = "Invalid document.";
    }
    else {
      if (error != PrematureEndOfDocumentError) goto LAB_003514dc;
      sourceText = "Premature end of document.";
    }
    QXmlStream::tr((QString *)&local_38,sourceText,(char *)0x0,-1);
    pDVar2 = (this->errorString).d.d;
    pcVar3 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_38.d;
    (this->errorString).d.ptr = local_38.ptr;
    qVar1 = (this->errorString).d.size;
    (this->errorString).d.size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
LAB_003514dc:
  this->type = Invalid;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::raiseError(QXmlStreamReader::Error error, const QString& message)
{
    this->error = error;
    errorString = message;
    if (errorString.isNull()) {
        if (error == QXmlStreamReader::PrematureEndOfDocumentError)
            errorString = QXmlStream::tr("Premature end of document.");
        else if (error == QXmlStreamReader::CustomError)
            errorString = QXmlStream::tr("Invalid document.");
    }

    type = QXmlStreamReader::Invalid;
}